

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayhelper.cpp
# Opt level: O0

double * ArrayHelper::getArray(size_t rows,size_t cols,bool zero)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double *pdVar3;
  ulong local_38;
  size_t j;
  size_t i;
  double *array;
  bool zero_local;
  size_t cols_local;
  size_t rows_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = rows * cols;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pdVar3 = (double *)operator_new__(uVar2);
  if (zero) {
    for (j = 0; j < rows; j = j + 1) {
      for (local_38 = 0; local_38 < cols; local_38 = local_38 + 1) {
        pdVar3[j * cols + local_38] = 0.0;
      }
    }
  }
  return pdVar3;
}

Assistant:

double* ArrayHelper::getArray(size_t rows, size_t cols, bool zero) {
	double* array = new double[rows*cols];
	if (zero) {
		for (size_t i = 0; i < rows; i++) {
			for (size_t j = 0; j < cols; j++) {
				array[i * cols + j] = 0;
			}
		}
	} 
	return array;
}